

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O2

void __thiscall Component::Component(Component *this,path *path)

{
  _Rb_tree_header *p_Var1;
  allocator local_52;
  allocator local_51 [17];
  unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
  *local_40;
  unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
  *local_38;
  
  std::__cxx11::string::string((string *)this,(string *)path);
  std::__cxx11::string::string((string *)&this->name,"",local_51);
  local_38 = &this->pubDeps;
  (this->pubDeps)._M_h._M_buckets = &(this->pubDeps)._M_h._M_single_bucket;
  (this->pubDeps)._M_h._M_bucket_count = 1;
  (this->pubDeps)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pubDeps)._M_h._M_element_count = 0;
  (this->pubDeps)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->pubDeps)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->pubDeps)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_40 = &this->privDeps;
  (this->privDeps)._M_h._M_buckets = &(this->privDeps)._M_h._M_single_bucket;
  (this->privDeps)._M_h._M_bucket_count = 1;
  (this->privDeps)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->privDeps)._M_h._M_element_count = 0;
  (this->privDeps)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->privDeps)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->privDeps)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->pubLinks)._M_h._M_buckets = &(this->pubLinks)._M_h._M_single_bucket;
  (this->pubLinks)._M_h._M_bucket_count = 1;
  (this->pubLinks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pubLinks)._M_h._M_element_count = 0;
  (this->pubLinks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->pubLinks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->pubLinks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->privLinks)._M_h._M_buckets = &(this->privLinks)._M_h._M_single_bucket;
  (this->privLinks)._M_h._M_bucket_count = 1;
  (this->privLinks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->privLinks)._M_h._M_element_count = 0;
  (this->privLinks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->privLinks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->privLinks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->circulars)._M_h._M_buckets = &(this->circulars)._M_h._M_single_bucket;
  (this->circulars)._M_h._M_bucket_count = 1;
  (this->circulars)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->circulars)._M_h._M_element_count = 0;
  (this->circulars)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->circulars)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->circulars)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->buildAfters)._M_t._M_impl.super__Rb_tree_header;
  (this->buildAfters)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->buildAfters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->buildAfters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->buildAfters)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->buildAfters)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->files)._M_h._M_buckets = &(this->files)._M_h._M_single_bucket;
  (this->files)._M_h._M_bucket_count = 1;
  (this->files)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->files)._M_h._M_element_count = 0;
  (this->files)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->files)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->files)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->recreate = false;
  this->hasAddonCmake = false;
  std::__cxx11::string::string((string *)&this->type,"add_library",&local_52);
  this->index = 0;
  this->lowlink = 0;
  (this->additionalTargetParameters)._M_dataplus._M_p =
       (pointer)&(this->additionalTargetParameters).field_2;
  (this->additionalTargetParameters)._M_string_length = 0;
  (this->additionalTargetParameters).field_2._M_local_buf[0] = '\0';
  (this->additionalCmakeDeclarations)._M_dataplus._M_p =
       (pointer)&(this->additionalCmakeDeclarations).field_2;
  (this->additionalCmakeDeclarations)._M_string_length = 0;
  (this->additionalCmakeDeclarations).field_2._M_local_buf[0] = '\0';
  this->onStack = false;
  return;
}

Assistant:

Component::Component(const filesystem::path &path)
        : root(path), name(""), recreate(false), hasAddonCmake(false), type("add_library"), index(0), lowlink(0), onStack(false) {
}